

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

RefPtr<wabt::interp::Trap> * __thiscall
wabt::interp::Store::
Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
          (RefPtr<wabt::interp::Trap> *__return_storage_ptr__,Store *this,Store *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *args_2)

{
  Trap *pTVar1;
  Index index;
  Trap *local_40;
  Ref local_38;
  Ref ref;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *args_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  Store *args_local;
  Store *this_local;
  RefPtr<wabt::interp::Trap> *ptr;
  
  ref.index = (size_t)args_2;
  pTVar1 = (Trap *)operator_new(0x78);
  Trap::Trap(pTVar1,args,args_1,
             (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)ref.index);
  local_40 = pTVar1;
  index = FreeList<wabt::interp::Object*>::New<wabt::interp::Trap*>
                    ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_40);
  Ref::Ref(&local_38,index);
  RefPtr<wabt::interp::Trap>::RefPtr(__return_storage_ptr__,this,local_38);
  pTVar1 = RefPtr<wabt::interp::Trap>::operator->(__return_storage_ptr__);
  (pTVar1->super_Object).self_.index = local_38.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}